

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O3

double __thiscall ddd::DictionarySGL<true,_true>::ratio_singles(DictionarySGL<true,_true> *this)

{
  DaTrie<true,_true,_false> *pDVar1;
  uint32_t uVar2;
  
  uVar2 = DaTrie<true,_true,_false>::num_singles
                    ((this->trie_)._M_t.
                     super___uniq_ptr_impl<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                     .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl);
  pDVar1 = (this->trie_)._M_t.
           super___uniq_ptr_impl<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
           .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl;
  return (double)uVar2 /
         (double)((int)((ulong)((long)*(pointer *)
                                       ((long)&(pDVar1->bc_).
                                               super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>
                                       + 8) -
                               *(long *)&(pDVar1->bc_).
                                         super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>) >> 3
                       ) - pDVar1->bc_emps_);
}

Assistant:

double ratio_singles() const { // not in constant time
    return static_cast<double>(trie_->num_singles()) / trie_->num_nodes();
  }